

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WorkSpace.cc
# Opt level: O0

void __thiscall WorkSpace::WorkSpace(WorkSpace *this,string *filename)

{
  bool bVar1;
  string *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  WorkSpace *in_stack_00000058;
  SequenceDistanceGraph *in_stack_00000060;
  undefined1 in_stack_00000387;
  string *in_stack_00000388;
  WorkSpace *in_stack_00000390;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  size_type *__n;
  vector<KmerCounter,_std::allocator<KmerCounter>_> *in_stack_ffffffffffffffc0;
  
  __lhs = in_RDI;
  SequenceDistanceGraph::SequenceDistanceGraph(in_stack_00000060,in_stack_00000058);
  std::vector<PairedReadsDatastore,_std::allocator<PairedReadsDatastore>_>::vector
            ((vector<PairedReadsDatastore,_std::allocator<PairedReadsDatastore>_> *)0x441c27);
  __n = &in_RDI[8]._M_string_length;
  std::vector<LinkedReadsDatastore,_std::allocator<LinkedReadsDatastore>_>::vector
            ((vector<LinkedReadsDatastore,_std::allocator<LinkedReadsDatastore>_> *)0x441c3d);
  std::vector<LongReadsDatastore,_std::allocator<LongReadsDatastore>_>::vector
            ((vector<LongReadsDatastore,_std::allocator<LongReadsDatastore>_> *)0x441c53);
  std::vector<KmerCounter,_std::allocator<KmerCounter>_>::vector
            ((vector<KmerCounter,_std::allocator<KmerCounter>_> *)0x441c69);
  std::vector<DistanceGraph,_std::allocator<DistanceGraph>_>::vector
            ((vector<DistanceGraph,_std::allocator<DistanceGraph>_> *)0x441c7f);
  std::vector<JournalOperation,_std::allocator<JournalOperation>_>::vector
            ((vector<JournalOperation,_std::allocator<JournalOperation>_> *)0x441c95);
  std::vector<LinkedReadsDatastore,_std::allocator<LinkedReadsDatastore>_>::reserve
            ((vector<LinkedReadsDatastore,_std::allocator<LinkedReadsDatastore>_> *)
             in_stack_ffffffffffffffc0,(size_type)__n);
  std::vector<PairedReadsDatastore,_std::allocator<PairedReadsDatastore>_>::reserve
            ((vector<PairedReadsDatastore,_std::allocator<PairedReadsDatastore>_> *)
             in_stack_ffffffffffffffc0,(size_type)__n);
  std::vector<LongReadsDatastore,_std::allocator<LongReadsDatastore>_>::reserve
            ((vector<LongReadsDatastore,_std::allocator<LongReadsDatastore>_> *)
             in_stack_ffffffffffffffc0,(size_type)__n);
  std::vector<KmerCounter,_std::allocator<KmerCounter>_>::reserve
            (in_stack_ffffffffffffffc0,(size_type)__n);
  bVar1 = std::operator!=(__lhs,(char *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78
                                                ));
  if (bVar1) {
    std::__cxx11::string::string((string *)&stack0xffffffffffffffc0,in_RSI);
    load_from_disk(in_stack_00000390,in_stack_00000388,(bool)in_stack_00000387);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
  }
  return;
}

Assistant:

WorkSpace::WorkSpace(const std::string &filename) : sdg(*this) {
    linked_reads_datastores.reserve(MAX_WORKSPACE_VECTOR_SIZE);
    paired_reads_datastores.reserve(MAX_WORKSPACE_VECTOR_SIZE);
    long_reads_datastores.reserve(MAX_WORKSPACE_VECTOR_SIZE);
    kmer_counters.reserve(MAX_WORKSPACE_VECTOR_SIZE);
    if (filename!="") load_from_disk(filename);
}